

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O2

uint16_t set_text(dw_rom *rom,size_t address,char *text)

{
  uint16_t uVar1;
  size_t sVar2;
  uint8_t *string;
  
  sVar2 = strlen(text);
  string = (uint8_t *)malloc(sVar2 + 1);
  strcpy((char *)string,text);
  ascii2dw(string);
  uVar1 = patch(rom,(uint32_t)address,(uint32_t)sVar2,string);
  free(string);
  return uVar1;
}

Assistant:

uint16_t set_text(dw_rom *rom, const size_t address, char *text)
{
    size_t size = strlen(text);
    uint8_t *translated = malloc(size+1);
    uint16_t patch_end;

    strcpy((char *)translated, text);
    ascii2dw(translated);
    patch_end = patch(rom, address, strlen(text), translated);
    free(translated);
    return patch_end;
}